

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_force_close(intptr_t uuid)

{
  fio_packet_s *pfVar1;
  fio_data_s *pfVar2;
  undefined8 *puVar3;
  int *piVar4;
  long lVar5;
  uint __fd;
  fio_packet_s *packet;
  long lVar6;
  long fd;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  pfVar2 = fio_data;
  if ((-1 < uuid) && (__fd = (uint)((ulong)uuid >> 8), __fd < fio_data->capa)) {
    fd = (long)(int)__fd;
    lVar6 = fd * 0xa8;
    if (*(char *)((long)fio_data + lVar6 + 0x6d) == (char)uuid) {
      if (*(char *)((long)fio_data + lVar6 + 0x70) == '\0') {
        *(undefined1 *)((long)fio_data + lVar6 + 0x70) = 1;
      }
      fio_lock((fio_lock_i *)((long)pfVar2 + lVar6 + 0x6e));
      pfVar2 = fio_data;
      puVar3 = (undefined8 *)((long)fio_data + lVar6 + 0x40);
      packet = (fio_packet_s *)*puVar3;
      *puVar3 = 0;
      *(undefined8 **)((long)pfVar2 + lVar6 + 0x48) = puVar3;
      *(undefined8 *)((long)pfVar2 + lVar6 + 0x50) = 0;
      LOCK();
      *(undefined1 *)((long)pfVar2 + lVar6 + 0x6e) = 0;
      UNLOCK();
      while (packet != (fio_packet_s *)0x0) {
        pfVar1 = packet->next;
        fio_packet_free(packet);
        packet = pfVar1;
      }
      if (((*(char *)((long)fio_data + lVar6 + 0x6f) != '\0') &&
          ((*(byte *)((long)fio_data + lVar6 + 0x70) & 1) != 0)) &&
         (lVar5 = (**(code **)(*(long *)((long)fio_data + lVar6 + 0xa8) + 0x18))(uuid), lVar5 != 0))
      {
        *(undefined1 *)((long)fio_data + lVar6 + 0x70) = 2;
        fio_touch(uuid);
        fio_poll_add_write(fd);
        return;
      }
      fio_lock((fio_lock_i *)((long)fio_data + lVar6 + 0x6c));
      fio_clear_fd(fd,'\0');
      LOCK();
      *(undefined1 *)((long)fio_data + lVar6 + 0x6c) = 0;
      UNLOCK();
      close(__fd);
      if (fio_data->connection_count == 0) {
        return;
      }
      LOCK();
      fio_data->connection_count = fio_data->connection_count - 1;
      UNLOCK();
      return;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 9;
  return;
}

Assistant:

void fio_force_close(intptr_t uuid) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return;
  }
  // FIO_LOG_DEBUG("fio_force_close called for uuid %p", (void *)uuid);
  /* make sure the close marker is set */
  if (!uuid_data(uuid).close)
    uuid_data(uuid).close = 1;
  /* clear away any packets in case we want to cut the connection short. */
  fio_packet_s *packet = NULL;
  fio_lock(&uuid_data(uuid).sock_lock);
  packet = uuid_data(uuid).packet;
  uuid_data(uuid).packet = NULL;
  uuid_data(uuid).packet_last = &uuid_data(uuid).packet;
  uuid_data(uuid).sent = 0;
  fio_unlock(&uuid_data(uuid).sock_lock);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  /* check for rw-hooks termination packet */
  if (uuid_data(uuid).open && (uuid_data(uuid).close & 1) &&
      uuid_data(uuid).rw_hooks->before_close(uuid, uuid_data(uuid).rw_udata)) {
    uuid_data(uuid).close = 2; /* don't repeat the before_close callback */
    fio_touch(uuid);
    fio_poll_add_write(fio_uuid2fd(uuid));
    return;
  }
  fio_lock(&uuid_data(uuid).protocol_lock);
  fio_clear_fd(fio_uuid2fd(uuid), 0);
  fio_unlock(&uuid_data(uuid).protocol_lock);
  close(fio_uuid2fd(uuid));
#if FIO_ENGINE_POLL
  fio_poll_remove_fd(fio_uuid2fd(uuid));
#endif
  if (fio_data->connection_count)
    fio_atomic_sub(&fio_data->connection_count, 1);
}